

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

void InitLZWCode(gif_source_ptr sinfo)

{
  gif_source_ptr in_RDI;
  
  in_RDI->last_byte = 2;
  in_RDI->code_buf[0] = '\0';
  in_RDI->code_buf[1] = '\0';
  in_RDI->last_bit = 0;
  in_RDI->cur_bit = 0;
  in_RDI->first_time = 1;
  in_RDI->out_of_blocks = 0;
  in_RDI->clear_code = 1 << ((byte)in_RDI->input_code_size & 0x1f);
  in_RDI->end_code = in_RDI->clear_code + 1;
  ReInitLZW(in_RDI);
  return;
}

Assistant:

LOCAL(void)
InitLZWCode(gif_source_ptr sinfo)
/* Initialize for a series of LZWReadByte (and hence GetCode) calls */
{
  /* GetCode initialization */
  sinfo->last_byte = 2;         /* make safe to "recopy last two bytes" */
  sinfo->code_buf[0] = 0;
  sinfo->code_buf[1] = 0;
  sinfo->last_bit = 0;          /* nothing in the buffer */
  sinfo->cur_bit = 0;           /* force buffer load on first call */
  sinfo->first_time = TRUE;
  sinfo->out_of_blocks = FALSE;

  /* LZWReadByte initialization: */
  /* compute special code values (note that these do not change later) */
  sinfo->clear_code = 1 << sinfo->input_code_size;
  sinfo->end_code = sinfo->clear_code + 1;
  ReInitLZW(sinfo);
}